

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O1

void Tim_ManCreate(Tim_Man_t *p,void *pLib,Vec_Flt_t *vInArrs,Vec_Flt_t *vOutReqs)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  Tim_Obj_t *pTVar4;
  int iVar5;
  int iVar6;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  float *pfVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  
  if (p->vDelayTables != (Vec_Ptr_t *)0x0) {
    __assert_fail("p->vDelayTables == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                  ,0x19e,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)");
  }
  if (pLib == (void *)0x0) {
    pVVar7 = (Vec_Ptr_t *)malloc(0x10);
    pVVar7->nCap = 100;
    pVVar7->nSize = 0;
    ppvVar8 = (void **)malloc(800);
    pVVar7->pArray = ppvVar8;
  }
  else {
    iVar6 = *(int *)(*(long *)((long)pLib + 8) + 4);
    pVVar7 = (Vec_Ptr_t *)malloc(0x10);
    iVar5 = 8;
    if (6 < iVar6 - 1U) {
      iVar5 = iVar6;
    }
    pVVar7->nSize = 0;
    pVVar7->nCap = iVar5;
    if (iVar5 == 0) {
      ppvVar8 = (void **)0x0;
    }
    else {
      ppvVar8 = (void **)malloc((long)iVar5 << 3);
    }
    pVVar7->pArray = ppvVar8;
    pVVar7->nSize = iVar6;
    memset(ppvVar8,0,(long)iVar6 << 3);
  }
  p->vDelayTables = pVVar7;
  if ((p->vBoxes != (Vec_Ptr_t *)0x0) && (pVVar7 = p->vBoxes, 0 < pVVar7->nSize)) {
    lVar12 = 0;
    do {
      pvVar2 = pVVar7->pArray[lVar12];
      uVar1 = *(uint *)((long)pvVar2 + 0x10);
      uVar10 = (ulong)uVar1;
      if ((pLib == (void *)0x0) || (uVar1 == 0xffffffff)) {
        iVar6 = *(int *)((long)pvVar2 + 8);
        iVar5 = *(int *)((long)pvVar2 + 0xc);
        uVar13 = iVar5 * iVar6;
        pfVar9 = (float *)malloc((long)(int)uVar13 * 4 + 0xc);
        *pfVar9 = (float)(int)uVar1;
        pfVar9[1] = (float)iVar6;
        pfVar9[2] = (float)iVar5;
        if (0 < (int)uVar13) {
          uVar10 = 0;
          do {
            pfVar9[uVar10 + 3] = 1.0;
            uVar10 = uVar10 + 1;
          } while (uVar13 != uVar10);
        }
        pVVar7 = p->vDelayTables;
        uVar1 = pVVar7->nSize;
        *(uint *)((long)pvVar2 + 0x10) = uVar1;
        uVar13 = pVVar7->nCap;
        if (uVar1 == uVar13) {
          if ((int)uVar13 < 0x10) {
            if (pVVar7->pArray == (void **)0x0) {
              ppvVar8 = (void **)malloc(0x80);
            }
            else {
              ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
            }
            pVVar7->pArray = ppvVar8;
            iVar6 = 0x10;
          }
          else {
            iVar6 = uVar13 * 2;
            if (iVar6 <= (int)uVar13) goto LAB_0049dc9b;
            if (pVVar7->pArray == (void **)0x0) {
              ppvVar8 = (void **)malloc((ulong)uVar13 << 4);
            }
            else {
              ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar13 << 4);
            }
            pVVar7->pArray = ppvVar8;
          }
          pVVar7->nCap = iVar6;
        }
LAB_0049dc9b:
        iVar6 = pVVar7->nSize;
        pVVar7->nSize = iVar6 + 1;
        pVVar7->pArray[iVar6] = pfVar9;
      }
      else {
        if (((int)uVar1 < 0) || (*(int *)(*(long *)((long)pLib + 8) + 4) <= (int)uVar1)) {
          __assert_fail("pBox->iDelayTable >= 0 && pBox->iDelayTable < Vec_PtrSize(pLibBox->vBoxes)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                        ,0x1b1,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)");
        }
        lVar3 = *(long *)(*(long *)(*(long *)((long)pLib + 8) + 8) + uVar10 * 8);
        if (lVar3 == 0) {
          __assert_fail("pIfBox != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                        ,0x1b3,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)");
        }
        iVar6 = *(int *)((long)pvVar2 + 8);
        if (*(int *)(lVar3 + 0x10) != iVar6) {
          __assert_fail("pIfBox->nPis == pBox->nInputs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                        ,0x1b4,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)");
        }
        iVar5 = *(int *)((long)pvVar2 + 0xc);
        if (*(int *)(lVar3 + 0x14) != iVar5) {
          __assert_fail("pIfBox->nPos == pBox->nOutputs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                        ,0x1b5,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)");
        }
        *(int *)((long)pvVar2 + 0x18) = (int)*(char *)(lVar3 + 9);
        if (p->vDelayTables->nSize <= (int)uVar1) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        ppvVar8 = p->vDelayTables->pArray;
        if (ppvVar8[uVar10] == (void *)0x0) {
          uVar13 = iVar5 * iVar6;
          pfVar9 = (float *)malloc((long)(int)uVar13 * 4 + 0xc);
          *pfVar9 = (float)(int)uVar1;
          pfVar9[1] = (float)iVar6;
          pfVar9[2] = (float)iVar5;
          if (0 < (int)uVar13) {
            lVar3 = *(long *)(lVar3 + 0x18);
            uVar11 = 0;
            do {
              pfVar9[uVar11 + 3] = (float)*(int *)(lVar3 + uVar11 * 4);
              uVar11 = uVar11 + 1;
            } while (uVar13 != uVar11);
          }
          ppvVar8[uVar10] = pfVar9;
        }
      }
      lVar12 = lVar12 + 1;
      pVVar7 = p->vBoxes;
    } while (lVar12 < pVVar7->nSize);
  }
  if (vInArrs != (Vec_Flt_t *)0x0) {
    iVar6 = vInArrs->nSize;
    if ((p->vBoxes == (Vec_Ptr_t *)0x0) || (p->vBoxes->nSize == 0)) {
      iVar5 = p->nCis;
    }
    else {
      iVar5 = Tim_ManBoxOutputFirst(p,0);
    }
    if (iVar6 != iVar5) {
      __assert_fail("Vec_FltSize(vInArrs) == Tim_ManPiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                    ,0x1c6,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)");
    }
    uVar1 = p->nCis;
    if ((0 < (int)uVar1) && (p->pCis != (Tim_Obj_t *)0x0)) {
      pfVar9 = &p->pCis->timeArr;
      uVar10 = 0;
      do {
        if ((int)pfVar9[-2] < 0) {
          if ((long)vInArrs->nSize <= (long)uVar10) goto LAB_0049ddea;
          *pfVar9 = vInArrs->pArray[uVar10];
        }
        uVar10 = uVar10 + 1;
        pfVar9 = pfVar9 + 6;
      } while (uVar1 != uVar10);
    }
  }
  if (vOutReqs != (Vec_Flt_t *)0x0) {
    iVar6 = vOutReqs->nSize;
    iVar5 = Tim_ManPoNum(p);
    if (iVar6 != iVar5) {
      __assert_fail("Vec_FltSize(vOutReqs) == Tim_ManPoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                    ,0x1cf,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)");
    }
    iVar6 = p->nCos;
    if ((long)iVar6 < 1) {
LAB_0049dda8:
      iVar5 = 0;
    }
    else {
      pTVar4 = p->pCos;
      lVar12 = 0;
      uVar10 = 0;
      do {
        if (pTVar4 == (Tim_Obj_t *)0x0) goto LAB_0049dda8;
        uVar11 = uVar10;
        if (*(int *)((long)&pTVar4->iObj2Box + lVar12) < 0) {
          iVar5 = (int)uVar10;
          if ((iVar5 < 0) || (vOutReqs->nSize <= iVar5)) {
LAB_0049ddea:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                          ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
          }
          uVar11 = (ulong)(iVar5 + 1);
          *(float *)((long)&pTVar4->timeReq + lVar12) = vOutReqs->pArray[uVar10];
        }
        iVar5 = (int)uVar11;
        lVar12 = lVar12 + 0x18;
        uVar10 = uVar11;
      } while ((long)iVar6 * 0x18 != lVar12);
    }
    iVar6 = Tim_ManPoNum(p);
    if (iVar5 != iVar6) {
      __assert_fail("k == Tim_ManPoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                    ,0x1d2,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)");
    }
  }
  return;
}

Assistant:

void Tim_ManCreate( Tim_Man_t * p, void * pLib, Vec_Flt_t * vInArrs, Vec_Flt_t * vOutReqs )
{
    If_LibBox_t * pLibBox = (If_LibBox_t *)pLib;
    If_Box_t * pIfBox;
    Tim_Box_t * pBox;
    Tim_Obj_t * pObj;
    float * pTable;
    int i, k;
    assert( p->vDelayTables == NULL );
    p->vDelayTables = pLibBox ? Vec_PtrStart( Vec_PtrSize(pLibBox->vBoxes) ) : Vec_PtrAlloc( 100 );
    if ( p->vBoxes )
    Tim_ManForEachBox( p, pBox, i )
    {
        if ( pBox->iDelayTable == -1 || pLibBox == NULL )
        {
            // create table with constants
            pTable = ABC_ALLOC( float, 3 + pBox->nInputs * pBox->nOutputs );
            pTable[0] = pBox->iDelayTable;
            pTable[1] = pBox->nInputs;
            pTable[2] = pBox->nOutputs;
            for ( k = 0; k < pBox->nInputs * pBox->nOutputs; k++ )
                pTable[3 + k] = 1.0;
            // save table
            pBox->iDelayTable = Vec_PtrSize(p->vDelayTables);
            Vec_PtrPush( p->vDelayTables, pTable );
            continue;
        }
        assert( pBox->iDelayTable >= 0 && pBox->iDelayTable < Vec_PtrSize(pLibBox->vBoxes) );
        pIfBox = (If_Box_t *)Vec_PtrEntry( pLibBox->vBoxes, pBox->iDelayTable );
        assert( pIfBox != NULL );
        assert( pIfBox->nPis == pBox->nInputs );
        assert( pIfBox->nPos == pBox->nOutputs );
        pBox->fBlack = pIfBox->fBlack;
        if ( Vec_PtrEntry( p->vDelayTables, pBox->iDelayTable ) != NULL )
            continue;
        // create table of boxes
        pTable = ABC_ALLOC( float, 3 + pBox->nInputs * pBox->nOutputs );
        pTable[0] = pBox->iDelayTable;
        pTable[1] = pBox->nInputs;
        pTable[2] = pBox->nOutputs;
        for ( k = 0; k < pBox->nInputs * pBox->nOutputs; k++ )
            pTable[3 + k] = pIfBox->pDelays[k];
        // save table
        Vec_PtrWriteEntry( p->vDelayTables, pBox->iDelayTable, pTable );
    }
    // create arrival times
    if ( vInArrs )
    {
        assert( Vec_FltSize(vInArrs) == Tim_ManPiNum(p) );
        Tim_ManForEachPi( p, pObj, i )
            pObj->timeArr = Vec_FltEntry(vInArrs, i);

    }
    // create required times
    if ( vOutReqs )
    {
        k = 0;
        assert( Vec_FltSize(vOutReqs) == Tim_ManPoNum(p) );
        Tim_ManForEachPo( p, pObj, i )
            pObj->timeReq = Vec_FltEntry(vOutReqs, k++);
        assert( k == Tim_ManPoNum(p) );
    }
}